

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.h
# Opt level: O0

any * __thiscall dap::any::operator=(any *this,any *rhs)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  any *rhs_local;
  any *this_local;
  
  reset(this);
  this->type = rhs->type;
  if (rhs->value != (void *)0x0) {
    iVar1 = (*this->type->_vptr_TypeInfo[3])();
    iVar2 = (*this->type->_vptr_TypeInfo[4])();
    alloc(this,CONCAT44(extraout_var,iVar1),CONCAT44(extraout_var_00,iVar2));
    (*this->type->_vptr_TypeInfo[6])(this->type,this->value,rhs->value);
  }
  return this;
}

Assistant:

any& any::operator=(const any& rhs) {
  reset();
  type = rhs.type;
  if (rhs.value != nullptr) {
    alloc(type->size(), type->alignment());
    type->copyConstruct(value, rhs.value);
  }
  return *this;
}